

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_func_call_arguments.cpp
# Opt level: O0

Status __thiscall spvtools::opt::FixFuncCallArgumentsPass::Process(FixFuncCallArgumentsPass *this)

{
  bool bVar1;
  Module *this_00;
  reference this_01;
  anon_class_16_2_0e352904 local_80;
  function<void_(spvtools::opt::Instruction_*)> local_70;
  reference local_50;
  value_type *func;
  iterator __end1;
  iterator __begin1;
  Module *__range1;
  FixFuncCallArgumentsPass *pFStack_18;
  bool modified;
  FixFuncCallArgumentsPass *this_local;
  
  __range1._7_1_ = 0;
  pFStack_18 = this;
  bVar1 = ModuleHasASingleFunction(this);
  if (bVar1) {
    this_local._4_4_ = SuccessWithoutChange;
  }
  else {
    this_00 = Pass::get_module(&this->super_Pass);
    join_0x00000010_0x00000000_ = Module::begin(this_00);
    _func = Module::end(this_00);
    while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                              &__end1.iterator_,
                              (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
      this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end1.iterator_);
      local_80.modified = (bool *)((long)&__range1 + 7);
      local_80.this = this;
      local_50 = this_01;
      std::function<void(spvtools::opt::Instruction*)>::
      function<spvtools::opt::FixFuncCallArgumentsPass::Process()::__0,void>
                ((function<void(spvtools::opt::Instruction*)> *)&local_70,&local_80);
      opt::Function::ForEachInst(this_01,&local_70,false,false);
      std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_70);
      UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end1.iterator_);
    }
    this_local._4_4_ = SuccessWithoutChange;
    if ((__range1._7_1_ & 1) != 0) {
      this_local._4_4_ = SuccessWithChange;
    }
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status FixFuncCallArgumentsPass::Process() {
  bool modified = false;
  if (ModuleHasASingleFunction()) return Status::SuccessWithoutChange;
  for (auto& func : *get_module()) {
    func.ForEachInst([this, &modified](Instruction* inst) {
      if (inst->opcode() == spv::Op::OpFunctionCall) {
        modified |= FixFuncCallArguments(inst);
      }
    });
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}